

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalGhsMultiGenerator::WriteHighLevelDirectives
          (cmGlobalGhsMultiGenerator *this,cmLocalGenerator *root,ostream *fout)

{
  cmake *pcVar1;
  char *pcVar2;
  ostream *poVar3;
  string *psVar4;
  cmGlobalGhsMultiGenerator *this_00;
  string tgt;
  allocator<char> local_91;
  string local_90;
  string local_70;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  local_50 = local_40;
  local_48 = 0;
  local_40[0] = 0;
  pcVar1 = (this->super_cmGlobalGenerator).CMakeInstance;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"GHS_PRIMARY_TARGET",(allocator<char> *)&local_70);
  pcVar2 = cmake::GetCacheDefinition(pcVar1,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  if ((pcVar2 == (char *)0x0) || (*pcVar2 == '\0')) {
    pcVar1 = (this->super_cmGlobalGenerator).CMakeInstance;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"CMAKE_GENERATOR_PLATFORM",(allocator<char> *)&local_70);
    cmake::GetCacheDefinition(pcVar1,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    pcVar1 = (this->super_cmGlobalGenerator).CMakeInstance;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"GHS_TARGET_PLATFORM",(allocator<char> *)&local_70);
    cmake::GetCacheDefinition(pcVar1,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::assign((char *)&local_50);
    std::__cxx11::string::append((char *)&local_50);
    std::__cxx11::string::append((char *)&local_50);
    std::__cxx11::string::append((char *)&local_50);
  }
  else {
    std::__cxx11::string::assign((char *)&local_50);
    pcVar1 = (this->super_cmGlobalGenerator).CMakeInstance;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"GHS_PRIMARY_TARGET",(allocator<char> *)&local_70);
    cmake::MarkCliAsUsed(pcVar1,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
  }
  poVar3 = std::operator<<(fout,"primaryTarget=");
  poVar3 = std::operator<<(poVar3,(string *)&local_50);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(fout,"customization=");
  psVar4 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(root);
  poVar3 = std::operator<<(poVar3,(string *)psVar4);
  poVar3 = std::operator<<(poVar3,"/CMakeFiles/custom_rule.bod");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(fout,"customization=");
  psVar4 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(root);
  poVar3 = std::operator<<(poVar3,(string *)psVar4);
  poVar3 = std::operator<<(poVar3,"/CMakeFiles/custom_target.bod");
  std::endl<char,std::char_traits<char>>(poVar3);
  pcVar1 = (this->super_cmGlobalGenerator).CMakeInstance;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"GHS_CUSTOMIZATION",(allocator<char> *)&local_70);
  this_00 = (cmGlobalGhsMultiGenerator *)cmake::GetCacheDefinition(pcVar1,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  if ((this_00 != (cmGlobalGhsMultiGenerator *)0x0) &&
     (*(char *)&(this_00->super_cmGlobalGenerator)._vptr_cmGlobalGenerator != '\0')) {
    poVar3 = std::operator<<(fout,"customization=");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,(char *)this_00,&local_91);
    TrimQuotes(&local_90,this_00,&local_70);
    poVar3 = std::operator<<(poVar3,(string *)&local_90);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    pcVar1 = (this->super_cmGlobalGenerator).CMakeInstance;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"GHS_CUSTOMIZATION",(allocator<char> *)&local_70);
    cmake::MarkCliAsUsed(pcVar1,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
  }
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void cmGlobalGhsMultiGenerator::WriteHighLevelDirectives(
  cmLocalGenerator* root, std::ostream& fout)
{
  /* set primary target */
  std::string tgt;
  const char* t =
    this->GetCMakeInstance()->GetCacheDefinition("GHS_PRIMARY_TARGET");
  if (t && *t != '\0') {
    tgt = t;
    this->GetCMakeInstance()->MarkCliAsUsed("GHS_PRIMARY_TARGET");
  } else {
    const char* a =
      this->GetCMakeInstance()->GetCacheDefinition("CMAKE_GENERATOR_PLATFORM");
    const char* p =
      this->GetCMakeInstance()->GetCacheDefinition("GHS_TARGET_PLATFORM");
    tgt = (a ? a : "");
    tgt += "_";
    tgt += (p ? p : "");
    tgt += ".tgt";
  }

  fout << "primaryTarget=" << tgt << std::endl;
  fout << "customization=" << root->GetBinaryDirectory()
       << "/CMakeFiles/custom_rule.bod" << std::endl;
  fout << "customization=" << root->GetBinaryDirectory()
       << "/CMakeFiles/custom_target.bod" << std::endl;

  char const* const customization =
    this->GetCMakeInstance()->GetCacheDefinition("GHS_CUSTOMIZATION");
  if (nullptr != customization && strlen(customization) > 0) {
    fout << "customization=" << this->TrimQuotes(customization) << std::endl;
    this->GetCMakeInstance()->MarkCliAsUsed("GHS_CUSTOMIZATION");
  }
}